

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_grid.hpp
# Opt level: O3

ostream * multidim::_impl_multi_grid::operator<<(ostream *os,Grid<float,_4UL,_2UL,_3UL> *rhs)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  ostream_iterator<float,_char,_std::char_traits<char>_> *poVar6;
  long lVar7;
  ulong uVar8;
  size_t idx;
  ArrayCoord coord;
  ostream_iterator<float,_char,_std::char_traits<char>_> local_68;
  ulong local_58;
  ostream *local_48;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Values : [ ",0xb);
  local_68._M_string = " ";
  uVar8 = 0x19;
  local_68._M_stream = os;
  do {
    std::ostream_iterator<float,_char,_std::char_traits<char>_>::operator=(&local_68,(float *)rhs);
    rhs = (Grid<float,_4UL,_2UL,_3UL> *)((long)rhs + 4);
    uVar8 = uVar8 - 1;
  } while (1 < uVar8);
  std::__ostream_insert<char,std::char_traits<char>>(os,"]\nMapping index to coord :\n",0x1b);
  uVar8 = 0;
  local_48 = os;
  do {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":{",2);
    local_68._M_stream = (ostream *)0x0;
    local_68._M_string = (char *)0x0;
    uVar4 = 0x18;
    lVar7 = 0;
    local_58 = uVar8;
    poVar6 = &local_68;
    bVar1 = true;
    do {
      bVar5 = bVar1;
      uVar4 = uVar4 / (ulong)(&DAT_00102098)[lVar7];
      pcVar3 = (char *)(local_58 / uVar4);
      local_58 = local_58 % uVar4;
      *(char **)poVar6 = pcVar3;
      lVar7 = 1;
      poVar6 = (ostream_iterator<float,_char,_std::char_traits<char>_> *)&local_68._M_string;
      bVar1 = false;
    } while (bVar5);
    local_40._M_string = ",";
    uVar4 = 4;
    poVar6 = &local_68;
    local_40._M_stream = os;
    do {
      std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::operator=
                (&local_40,(unsigned_long *)poVar6);
      os = local_48;
      poVar6 = (ostream_iterator<float,_char,_std::char_traits<char>_> *)((long)poVar6 + 8);
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
    std::__ostream_insert<char,std::char_traits<char>>(local_48,"}:",2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    local_40._M_stream = (ostream_type *)CONCAT71(local_40._M_stream._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_40,1);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x18);
  return os;
}

Assistant:

auto& operator<<(std::ostream &os, const Grid& rhs) 
    {
        os << "Values : [ ";
        std::copy(rhs.values_.begin(), rhs.values_.end(), 
            std::ostream_iterator<typename Grid::value_type>(os, " "));

        os << "]\nMapping index to coord :\n";
        for(size_t idx = 0; idx < rhs.prod_dims; idx ++) {
            os << idx << ":{";
            auto coord = rhs.unflatten(idx);
            std::copy(coord.begin(), coord.end(), 
                std::ostream_iterator<typename ArrayCoord::value_type>(os, ","));
            os << "}:" << rhs.flatten(coord) << ' ';
        }

        return os;
    }